

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STP_BigSphere.cpp
# Opt level: O1

bool __thiscall
sch::STP_BigSphere::isHereFirstNeighbourPrime(STP_BigSphere *this,Vector3 *v,int idp)

{
  int iVar1;
  
  iVar1 = (this->m_VVR0).m_outerSTP;
  if (((iVar1 == idp) ||
      (0.0 <= (this->m_VVR0).m_axis.m_z * v->m_z +
              (this->m_VVR0).m_axis.m_x * v->m_x + (this->m_VVR0).m_axis.m_y * v->m_y)) &&
     ((iVar1 = (this->m_VVR1).m_outerSTP, iVar1 == idp ||
      (0.0 <= (this->m_VVR1).m_axis.m_z * v->m_z +
              (this->m_VVR1).m_axis.m_x * v->m_x + (this->m_VVR1).m_axis.m_y * v->m_y)))) {
    iVar1 = (this->m_VVR2).m_outerSTP;
    if (iVar1 == idp) {
      return true;
    }
    if (0.0 <= (this->m_VVR2).m_axis.m_z * v->m_z +
               (this->m_VVR2).m_axis.m_x * v->m_x + (this->m_VVR2).m_axis.m_y * v->m_y) {
      return true;
    }
  }
  (this->super_STP_Feature).m_nextBVPrime = iVar1;
  return false;
}

Assistant:

bool STP_BigSphere::isHereFirstNeighbourPrime(const Vector3 & v, int idp)
{
  //	std::cout << "test is here big sphere" << std::endl;
  if((m_VVR0.m_outerSTP != idp) && (m_VVR0.isInsidePlane(v) < 0))
  {
    m_nextBVPrime = m_VVR0.m_outerSTP;
    return false;
  }
  if((m_VVR1.m_outerSTP != idp) && (m_VVR1.isInsidePlane(v) < 0))
  {
    m_nextBVPrime = m_VVR1.m_outerSTP;
    return false;
  }
  if((m_VVR2.m_outerSTP != idp) && (m_VVR2.isInsidePlane(v) < 0))
  {
    m_nextBVPrime = m_VVR2.m_outerSTP;
    return false;
  }
  return true;
}